

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_0::MembranePipelineHook::~MembranePipelineHook(MembranePipelineHook *this)

{
  MembranePolicy *pMVar1;
  Disposer *pDVar2;
  PipelineHook *pPVar3;
  
  pMVar1 = (this->policy).ptr;
  if (pMVar1 != (MembranePolicy *)0x0) {
    (this->policy).ptr = (MembranePolicy *)0x0;
    pDVar2 = (this->policy).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pMVar1->_vptr_MembranePolicy + (long)pMVar1->_vptr_MembranePolicy[-2])
              );
  }
  pPVar3 = (this->inner).ptr;
  if (pPVar3 != (PipelineHook *)0x0) {
    (this->inner).ptr = (PipelineHook *)0x0;
    pDVar2 = (this->inner).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PipelineHook[-2] + (long)&pPVar3->_vptr_PipelineHook);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

MembranePipelineHook(
      kj::Own<PipelineHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), reverse(reverse) {}